

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

void packint(luaL_Buffer *b,lua_Unsigned n,int islittle,int size,int neg)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  
  pcVar2 = luaL_prepbuffsize(b,(long)size);
  iVar3 = 0;
  if (islittle == 0) {
    iVar3 = size + -1;
  }
  pcVar2[iVar3] = (char)n;
  if (1 < size) {
    iVar3 = size + -2;
    iVar5 = 1;
    do {
      iVar7 = iVar5;
      if (islittle == 0) {
        iVar7 = iVar3;
      }
      iVar5 = iVar5 + 1;
      bVar8 = iVar3 != 0;
      iVar3 = iVar3 + -1;
      pcVar2[iVar7] = (char)(n >> 8);
      n = n >> 8;
    } while (bVar8);
    if (8 < size && neg != 0) {
      auVar11 = vpmovsxbd_avx512f(_DAT_0015db6c);
      auVar12 = vpmovsxbd_avx512f(_DAT_0015db7c);
      auVar13 = vpmovsxbd_avx512f(_DAT_0015db8c);
      auVar14 = vpmovsxbd_avx512f(_DAT_0015db9c);
      auVar15 = vpmovsxbd_avx512f(_DAT_0015dbac);
      auVar16 = vpmovsxbd_avx512f(_DAT_0015dbbc);
      auVar17 = vpmovsxbd_avx512f(_DAT_0015dbcc);
      auVar18 = vpmovsxbd_avx512f(_DAT_0015dbdc);
      auVar19 = vpbroadcastd_avx512f(ZEXT416(0x40));
      auVar20 = vpbroadcastd_avx512f();
      uVar4 = 0;
      auVar21 = vpbroadcastd_avx512f();
      do {
        if (islittle == 0) {
          auVar25 = vpsubd_avx512f(auVar20,auVar14);
          auVar24 = vpsubd_avx512f(auVar20,auVar13);
          auVar23 = vpsubd_avx512f(auVar20,auVar12);
          auVar22 = vpsubd_avx512f(auVar20,auVar11);
        }
        else {
          auVar22 = vmovdqa64_avx512f(auVar11);
          auVar23 = vmovdqa64_avx512f(auVar12);
          auVar24 = vmovdqa64_avx512f(auVar13);
          auVar25 = vmovdqa64_avx512f(auVar14);
        }
        auVar26 = vpbroadcastd_avx512f();
        auVar27 = vpord_avx512f(auVar26,auVar18);
        uVar1 = vpcmpud_avx512f(auVar27,auVar21,2);
        auVar27 = vpmovsxdq_avx512f(auVar25._0_32_);
        if ((uVar1 & 1) != 0) {
          pcVar2[auVar27._0_8_] = -1;
        }
        if ((uVar1 & 2) != 0) {
          pcVar2[auVar27._8_8_] = -1;
        }
        if ((uVar1 & 4) != 0) {
          auVar9 = vextracti32x4_avx512vl(auVar27._0_32_,1);
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 8) != 0) {
          auVar9 = vextracti32x4_avx512vl(auVar27._0_32_,1);
          pcVar2[auVar9._8_8_] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar27,2);
        if ((uVar1 & 0x10) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x20) != 0) {
          pcVar2[auVar9._8_8_] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar27,3);
        if ((uVar1 & 0x40) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x80) != 0) {
          pcVar2[auVar9._8_8_] = -1;
        }
        auVar10 = vextracti64x4_avx512f(auVar25,1);
        auVar25 = vpmovsxdq_avx512f(auVar10);
        if ((uVar1 & 0x100) != 0) {
          pcVar2[auVar25._0_8_] = -1;
        }
        if ((uVar1 & 0x200) != 0) {
          lVar6 = vpextrq_avx(auVar25._0_16_,1);
          pcVar2[lVar6] = -1;
        }
        if ((uVar1 & 0x400) != 0) {
          auVar9 = vextracti32x4_avx512vl(auVar25._0_32_,1);
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x800) != 0) {
          auVar9 = vextracti32x4_avx512vl(auVar25._0_32_,1);
          pcVar2[auVar9._8_8_] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar25,2);
        if ((uVar1 & 0x1000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x2000) != 0) {
          pcVar2[auVar9._8_8_] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar25,3);
        if ((uVar1 & 0x4000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x8000) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar25 = vpmovsxdq_avx512f(auVar24._0_32_);
        auVar27 = vpord_avx512f(auVar26,auVar17);
        uVar1 = vpcmpud_avx512f(auVar27,auVar21,2);
        if ((uVar1 & 1) != 0) {
          pcVar2[auVar25._0_8_] = -1;
        }
        if ((uVar1 & 2) != 0) {
          lVar6 = vpextrq_avx(auVar25._0_16_,1);
          pcVar2[lVar6] = -1;
        }
        if ((uVar1 & 4) != 0) {
          auVar9 = vextracti32x4_avx512vl(auVar25._0_32_,1);
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 8) != 0) {
          auVar9 = vextracti32x4_avx512vl(auVar25._0_32_,1);
          pcVar2[auVar9._8_8_] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar25,2);
        if ((uVar1 & 0x10) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x20) != 0) {
          pcVar2[auVar9._8_8_] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar25,3);
        if ((uVar1 & 0x40) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x80) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar10 = vextracti64x4_avx512f(auVar24,1);
        auVar24 = vpmovsxdq_avx512f(auVar10);
        if ((uVar1 & 0x100) != 0) {
          pcVar2[auVar24._0_8_] = -1;
        }
        if ((uVar1 & 0x200) != 0) {
          lVar6 = vpextrq_avx(auVar24._0_16_,1);
          pcVar2[lVar6] = -1;
        }
        if ((uVar1 & 0x400) != 0) {
          pcVar2[auVar24._16_8_] = -1;
        }
        if ((uVar1 & 0x800) != 0) {
          lVar6 = vpextrq_avx(auVar24._16_16_,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar24,2);
        if ((uVar1 & 0x1000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x2000) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar24,3);
        if ((uVar1 & 0x4000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x8000) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar24 = vpmovsxdq_avx512f(auVar23._0_32_);
        auVar25 = vpord_avx512f(auVar26,auVar16);
        uVar1 = vpcmpud_avx512f(auVar25,auVar21,2);
        if ((uVar1 & 1) != 0) {
          pcVar2[auVar24._0_8_] = -1;
        }
        if ((uVar1 & 2) != 0) {
          lVar6 = vpextrq_avx(auVar24._0_16_,1);
          pcVar2[lVar6] = -1;
        }
        if ((uVar1 & 4) != 0) {
          pcVar2[auVar24._16_8_] = -1;
        }
        if ((uVar1 & 8) != 0) {
          lVar6 = vpextrq_avx(auVar24._16_16_,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar24,2);
        if ((uVar1 & 0x10) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x20) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar24,3);
        if ((uVar1 & 0x40) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x80) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar10 = vextracti64x4_avx512f(auVar23,1);
        auVar23 = vpmovsxdq_avx512f(auVar10);
        if ((uVar1 & 0x100) != 0) {
          pcVar2[auVar23._0_8_] = -1;
        }
        if ((uVar1 & 0x200) != 0) {
          lVar6 = vpextrq_avx(auVar23._0_16_,1);
          pcVar2[lVar6] = -1;
        }
        if ((uVar1 & 0x400) != 0) {
          pcVar2[auVar23._16_8_] = -1;
        }
        if ((uVar1 & 0x800) != 0) {
          lVar6 = vpextrq_avx(auVar23._16_16_,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar23,2);
        if ((uVar1 & 0x1000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x2000) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar23,3);
        if ((uVar1 & 0x4000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x8000) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar23 = vpord_avx512f(auVar26,auVar15);
        auVar24 = vpmovsxdq_avx512f(auVar22._0_32_);
        uVar1 = vpcmpud_avx512f(auVar23,auVar21,2);
        if ((uVar1 & 1) != 0) {
          pcVar2[auVar24._0_8_] = -1;
        }
        if ((uVar1 & 2) != 0) {
          lVar6 = vpextrq_avx(auVar24._0_16_,1);
          pcVar2[lVar6] = -1;
        }
        if ((uVar1 & 4) != 0) {
          pcVar2[auVar24._16_8_] = -1;
        }
        if ((uVar1 & 8) != 0) {
          lVar6 = vpextrq_avx(auVar24._16_16_,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar24,2);
        if ((uVar1 & 0x10) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x20) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar24,3);
        if ((uVar1 & 0x40) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x80) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar10 = vextracti64x4_avx512f(auVar22,1);
        auVar22 = vpmovsxdq_avx512f(auVar10);
        if ((uVar1 & 0x100) != 0) {
          pcVar2[auVar22._0_8_] = -1;
        }
        if ((uVar1 & 0x200) != 0) {
          lVar6 = vpextrq_avx(auVar22._0_16_,1);
          pcVar2[lVar6] = -1;
        }
        if ((uVar1 & 0x400) != 0) {
          pcVar2[auVar22._16_8_] = -1;
        }
        if ((uVar1 & 0x800) != 0) {
          lVar6 = vpextrq_avx(auVar22._16_16_,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar22,2);
        if ((uVar1 & 0x1000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x2000) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        auVar9 = vextracti32x4_avx512f(auVar22,3);
        if ((uVar1 & 0x4000) != 0) {
          pcVar2[auVar9._0_8_] = -1;
        }
        if ((uVar1 & 0x8000) != 0) {
          lVar6 = vpextrq_avx(auVar9,1);
          pcVar2[lVar6] = -1;
        }
        uVar4 = uVar4 + 0x40;
        auVar14 = vpaddd_avx512f(auVar14,auVar19);
        auVar13 = vpaddd_avx512f(auVar13,auVar19);
        auVar12 = vpaddd_avx512f(auVar12,auVar19);
        auVar11 = vpaddd_avx512f(auVar11,auVar19);
      } while ((size + 0x37U & 0xffffffc0) != uVar4);
    }
  }
  b->n = b->n + (long)size;
  return;
}

Assistant:

static void packint (luaL_Buffer *b, lua_Unsigned n,
                     int islittle, int size, int neg) {
  char *buff = luaL_prepbuffsize(b, size);
  int i;
  buff[islittle ? 0 : size - 1] = (char)(n & MC);  /* first byte */
  for (i = 1; i < size; i++) {
    n >>= NB;
    buff[islittle ? i : size - 1 - i] = (char)(n & MC);
  }
  if (neg && size > SZINT) {  /* negative number need sign extension? */
    for (i = SZINT; i < size; i++)  /* correct extra bytes */
      buff[islittle ? i : size - 1 - i] = (char)MC;
  }
  luaL_addsize(b, size);  /* add result to buffer */
}